

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O0

Vec_Ptr_t * Cec_ManPatPackPatterns(Vec_Int_t *vCexStore,int nInputs,int nRegs,int nWordsInit)

{
  int iVar1;
  int Entry;
  Vec_Int_t *p;
  Vec_Ptr_t *vInfo_00;
  Vec_Ptr_t *vInfo_01;
  int *pLits;
  int local_54;
  int local_50;
  int nBits;
  int nWords;
  int nPatterns;
  int kMax;
  int iStart;
  int nSize;
  int k;
  Vec_Ptr_t *vPres;
  Vec_Ptr_t *vInfo;
  Vec_Int_t *vPat;
  int nWordsInit_local;
  int nRegs_local;
  int nInputs_local;
  Vec_Int_t *vCexStore_local;
  
  nWords = 0;
  local_54 = nWordsInit << 5;
  if (nInputs < nRegs) {
    __assert_fail("nRegs <= nInputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                  ,0x209,"Vec_Ptr_t *Cec_ManPatPackPatterns(Vec_Int_t *, int, int, int)");
  }
  p = Vec_IntAlloc(100);
  vInfo_00 = Vec_PtrAllocSimInfo(nInputs,nWordsInit);
  Vec_PtrCleanSimInfo(vInfo_00,0,nWordsInit);
  Gia_ManRandomInfo(vInfo_00,nRegs,0,nWordsInit);
  vInfo_01 = Vec_PtrAllocSimInfo(nInputs,nWordsInit);
  Vec_PtrCleanSimInfo(vInfo_01,0,nWordsInit);
  nPatterns = 0;
  local_50 = nWordsInit;
  do {
    do {
      iVar1 = Vec_IntSize(vCexStore);
      if (iVar1 <= nPatterns) {
        Vec_PtrFree(vInfo_01);
        Vec_IntFree(p);
        return vInfo_00;
      }
      iVar1 = nPatterns + 1;
      nPatterns = nPatterns + 2;
      iVar1 = Vec_IntEntry(vCexStore,iVar1);
    } while (iVar1 < 1);
    Vec_IntClear(p);
    for (iStart = 0; iStart < iVar1; iStart = iStart + 1) {
      Entry = Vec_IntEntry(vCexStore,nPatterns);
      Vec_IntPush(p,Entry);
      nPatterns = nPatterns + 1;
    }
    for (iStart = 1; iStart < local_54;
        iStart = (uint)((iStart + 1) % (nWordsInit << 5) == 0) + iStart + 1) {
      pLits = Vec_IntArray(p);
      iVar1 = Vec_IntSize(p);
      iVar1 = Cec_ManPatCollectTry(vInfo_00,vInfo_01,iStart,pLits,iVar1);
      if (iVar1 != 0) break;
    }
    nWords = Abc_MaxInt(nWords,iStart);
    if (iStart == local_54 + -1) {
      Vec_PtrReallocSimInfo(vInfo_00);
      Vec_PtrCleanSimInfo(vInfo_00,local_50,local_50 << 1);
      Gia_ManRandomInfo(vInfo_00,nRegs,local_50,local_50 << 1);
      Vec_PtrReallocSimInfo(vInfo_01);
      Vec_PtrCleanSimInfo(vInfo_01,local_50,local_50 << 1);
      local_50 = local_50 << 1;
      local_54 = local_54 << 1;
    }
  } while( true );
}

Assistant:

Vec_Ptr_t * Cec_ManPatPackPatterns( Vec_Int_t * vCexStore, int nInputs, int nRegs, int nWordsInit )
{
    Vec_Int_t * vPat;
    Vec_Ptr_t * vInfo, * vPres;
    int k, nSize, iStart, kMax = 0, nPatterns = 0;
    int nWords = nWordsInit;
    int nBits = 32 * nWords;
//    int RetValue;
    assert( nRegs <= nInputs );
    vPat  = Vec_IntAlloc( 100 );

    vInfo = Vec_PtrAllocSimInfo( nInputs, nWords );
    Vec_PtrCleanSimInfo( vInfo, 0, nWords );
    Gia_ManRandomInfo( vInfo, nRegs, 0, nWords );

    vPres = Vec_PtrAllocSimInfo( nInputs, nWords );
    Vec_PtrCleanSimInfo( vPres, 0, nWords );
    iStart = 0;
    while ( iStart < Vec_IntSize(vCexStore) )
    {
        nPatterns++;
        // skip the output number
        iStart++;
        // get the number of items
        nSize = Vec_IntEntry( vCexStore, iStart++ );
        if ( nSize <= 0 )
            continue;
        // extract pattern
        Vec_IntClear( vPat );
        for ( k = 0; k < nSize; k++ )
            Vec_IntPush( vPat, Vec_IntEntry( vCexStore, iStart++ ) );
        // add pattern to storage
        for ( k = 1; k < nBits; k++, k += ((k % (32 * nWordsInit)) == 0) )
            if ( Cec_ManPatCollectTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) ) )
                break;

//        k = kMax + 1;
//        RetValue = Cec_ManPatCollectTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) );
//        assert( RetValue == 1 );

        kMax = Abc_MaxInt( kMax, k );
        if ( k == nBits-1 )
        {
            Vec_PtrReallocSimInfo( vInfo );
            Vec_PtrCleanSimInfo( vInfo, nWords, 2*nWords );
            Gia_ManRandomInfo( vInfo, nRegs, nWords, 2*nWords );

            Vec_PtrReallocSimInfo( vPres );
            Vec_PtrCleanSimInfo( vPres, nWords, 2*nWords );
            nWords *= 2;
            nBits *= 2;
        }
    }
//    Abc_Print( 1, "packed %d patterns into %d vectors (out of %d)\n", nPatterns, kMax, nBits );
    Vec_PtrFree( vPres );
    Vec_IntFree( vPat );
    return vInfo;
}